

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmForEachCommand.cxx
# Opt level: O2

bool anon_unknown.dwarf_d3527d::TryParseInteger(cmExecutionStatus *status,string *str,int *i)

{
  int iVar1;
  ostringstream e;
  
  iVar1 = std::__cxx11::stoi(str,(size_t *)0x0,10);
  *i = iVar1;
  return true;
}

Assistant:

bool TryParseInteger(cmExecutionStatus& status, const std::string& str, int& i)
{
  try {
    i = std::stoi(str);
  } catch (std::invalid_argument&) {
    std::ostringstream e;
    e << "Invalid integer: '" << str << "'";
    status.SetError(e.str());
    cmSystemTools::SetFatalErrorOccurred();
    return false;
  } catch (std::out_of_range&) {
    std::ostringstream e;
    e << "Integer out of range: '" << str << "'";
    status.SetError(e.str());
    cmSystemTools::SetFatalErrorOccurred();
    return false;
  }

  return true;
}